

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O3

Error asmjit::v1_14::EmitterUtils::logInstructionFailed
                (BaseEmitter *self,Error err,InstId instId,InstOptions options,Operand_ *o0,
                Operand_ *o1,Operand_ *o2,Operand_ *opExt)

{
  Error EVar1;
  char *pcVar2;
  InstId local_1d8;
  InstOptions local_1d4;
  RegOnly local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  char *local_1b0;
  char local_1a8 [272];
  Operand_ local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  uint32_t local_48;
  uint32_t uStack_44;
  uint32_t uStack_40;
  uint32_t uStack_3c;
  
  local_1b0 = local_1a8;
  uStack_1c0 = 0;
  local_1c8 = 0x20;
  local_1b8 = 0x107;
  local_1a8[0] = '\0';
  pcVar2 = DebugUtils::errorAsString(err);
  String::_opString((String *)&local_1c8,kAppend,pcVar2,0xffffffffffffffff);
  String::_opString((String *)&local_1c8,kAppend,": ",0xffffffffffffffff);
  local_98._signature._bits = (o0->_signature)._bits;
  local_98._baseId = o0->_baseId;
  local_98._data = *&o0->_data;
  local_88._0_4_ = o1->_signature;
  local_88._4_4_ = o1->_baseId;
  uStack_80 = *(undefined8 *)o1->_data;
  local_78._0_4_ = o2->_signature;
  local_78._4_4_ = o2->_baseId;
  uStack_70 = *(undefined8 *)o2->_data;
  local_68._0_4_ = opExt->_signature;
  local_68._4_4_ = opExt->_baseId;
  uStack_60 = *(undefined8 *)opExt->_data;
  local_58._0_4_ = opExt[1]._signature;
  local_58._4_4_ = opExt[1]._baseId;
  uStack_50 = *(undefined8 *)opExt[1]._data;
  local_48 = opExt[2]._signature._bits;
  uStack_44 = opExt[2]._baseId;
  uStack_40 = opExt[2]._data[0];
  uStack_3c = opExt[2]._data[1];
  local_1d0 = self->_extraReg;
  local_1d8 = instId;
  local_1d4 = options;
  (*(self->_funcs).formatInstruction)
            ((String *)&local_1c8,kRegType,self,(self->_environment)._arch,(BaseInst *)&local_1d8,
             &local_98,6);
  if (self->_inlineComment != (char *)0x0) {
    String::_opString((String *)&local_1c8,kAppend," ; ",0xffffffffffffffff);
    String::_opString((String *)&local_1c8,kAppend,self->_inlineComment,0xffffffffffffffff);
  }
  self->_instOptions = kNone;
  (self->_extraReg)._signature = 0;
  *(undefined8 *)&(self->_extraReg)._id = 0;
  *(undefined4 *)((long)&self->_inlineComment + 4) = 0;
  pcVar2 = local_1b0;
  if ((byte)local_1c8._0_1_ < 0x1f) {
    pcVar2 = (char *)((long)&local_1c8 + 1);
  }
  EVar1 = BaseEmitter::reportError(self,err,pcVar2);
  String::reset((String *)&local_1c8);
  return EVar1;
}

Assistant:

Error logInstructionFailed(
  BaseEmitter* self,
  Error err,
  InstId instId,
  InstOptions options,
  const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_* opExt) {

  StringTmp<256> sb;
  sb.append(DebugUtils::errorAsString(err));
  sb.append(": ");

  Operand_ opArray[Globals::kMaxOpCount];
  opArrayFromEmitArgs(opArray, o0, o1, o2, opExt);

  self->_funcs.formatInstruction(sb, FormatFlags::kRegType, self, self->arch(), BaseInst(instId, options, self->extraReg()), opArray, Globals::kMaxOpCount);

  if (self->inlineComment()) {
    sb.append(" ; ");
    sb.append(self->inlineComment());
  }

  self->resetState();
  return self->reportError(err, sb.data());
}